

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.cpp
# Opt level: O1

NodeRef __thiscall slang::IntervalMapDetails::Path::getRightSibling(Path *this,uint32_t level)

{
  pointer pEVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  NodeRef NVar5;
  int iVar6;
  uint32_t uVar7;
  uint uVar8;
  
  pEVar1 = (this->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
  uVar4 = 0;
  uVar2 = level - 1;
  iVar3 = 0;
  do {
    iVar6 = iVar3;
    uVar8 = uVar2;
    if (uVar8 == 0) {
      uVar7 = 1;
      goto LAB_003cfb3a;
    }
    uVar2 = uVar8 - 1;
    iVar3 = iVar6 + 1;
  } while (pEVar1[uVar8].offset == pEVar1[uVar8].size - 1);
  uVar7 = uVar8 + 1;
  uVar4 = uVar8;
LAB_003cfb3a:
  pEVar1 = (this->path).super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_;
  if (pEVar1[uVar4].offset == pEVar1[uVar4].size - 1) {
    NVar5.pip.value = (PointerIntPair<void_*,_6U,_6U,_unsigned_int>)0;
  }
  else {
    NVar5.pip.value =
         *(PointerIntPair<void_*,_6U,_6U,_unsigned_int> *)
          ((long)pEVar1[uVar4].node + (ulong)(pEVar1[uVar4].offset + 1) * 8);
    if (uVar7 != level) {
      do {
        NVar5.pip.value =
             *(PointerIntPair<void_*,_6U,_6U,_unsigned_int> *)
              ((ulong)NVar5.pip.value & 0xffffffffffffffc0);
        iVar6 = iVar6 + -1;
      } while (iVar6 != 0);
    }
  }
  return (NodeRef)NVar5.pip.value;
}

Assistant:

NodeRef Path::getRightSibling(uint32_t level) const {
    SLANG_ASSERT(level > 0);

    // Go up until we can go right.
    uint32_t l = level - 1;
    while (l && path[l].offset == path[l].size - 1)
        --l;

    // If we hit the root there is no right sibling.
    if (path[l].offset == path[l].size - 1)
        return NodeRef();

    // Start with right subtree and go down to the left
    // until we reach the original level.
    NodeRef node = path[l].childAt(path[l].offset + 1);
    for (++l; l != level; ++l)
        node = node.childAt(0);
    return node;
}